

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O3

void density_tests::heterogeneous_queue_reentrant_put_transaction_samples(void)

{
  ControlBlock *pCVar1;
  ControlBlock **ppCVar2;
  int *piVar3;
  Msg *pMVar4;
  ostream *poVar5;
  runtime_type<> *prVar6;
  type_info *ptVar7;
  size_t sVar8;
  double *pdVar9;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar10;
  size_t sVar11;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar12;
  size_t i_len;
  size_t i_len_00;
  char *pcVar13;
  uchar *data;
  long lVar14;
  type transaction2;
  reentrant_put_transaction<void> transaction;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  int value;
  int value_2;
  reentrant_put_transaction<int> local_d8;
  const_iterator local_c0;
  reentrant_put_transaction<int> local_a0;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_88;
  double local_78;
  int local_6c;
  reentrant_put_transaction<int> local_68;
  const_iterator local_50;
  
  local_c0.m_control = (ControlBlock *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_c0);
  local_a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_88.m_head = (ControlBlock *)CONCAT44(local_88.m_head._4_4_,1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_d8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0,(int *)&local_88);
  local_c0.m_control = (ControlBlock *)local_d8.m_queue;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       local_d8.m_put_data.m_control_block;
  local_c0.m_value.m_pair.m_address = local_d8.m_put_data.m_user_storage;
  local_d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
  local_d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       local_c0.m_control;
  local_d8.m_put_data.m_control_block = (ControlBlock *)local_c0.m_queue;
  local_d8.m_put_data.m_user_storage = local_c0.m_value.m_pair.m_address;
  local_c0.m_control = (ControlBlock *)0x0;
  piVar3 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::element_ptr(&local_d8);
  if (*piVar3 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x341,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::commit(&local_d8);
  if (local_d8.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x345,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&local_c0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0);
  local_88.m_head = (ControlBlock *)&DAT_0000ffef;
  local_88.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_queue._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>(&local_d8,&local_88,(int *)&local_a0);
  local_c0.m_control = (ControlBlock *)local_d8.m_queue;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       local_d8.m_put_data.m_control_block;
  local_c0.m_value.m_pair.m_address = local_d8.m_put_data.m_user_storage;
  local_d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
  local_d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_78 = (double)CONCAT44(local_78._4_4_,1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>(&local_a0,&local_88,(int *)&local_78);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_d8,&local_a0)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_a0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_d8,
             (reentrant_put_transaction<int> *)&local_c0);
  if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_c0.m_control !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x370,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)&local_d8);
  if (local_d8.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x372,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_d8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&local_c0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_88);
  local_d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_d8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  std::chrono::_V2::system_clock::now();
  local_a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_a0.m_queue._4_4_,0x2a);
  local_88.m_head = (ControlBlock *)CONCAT44(local_88.m_head._4_4_,0x237);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_d8,&local_a0,i_len);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_d8,&local_88,i_len_00);
  if (local_d8.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_d8.m_put_data.m_control_block) {
    phVar12 = local_d8.m_queue;
    phVar10 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_d8.m_put_data.m_control_block;
    do {
      while (pCVar1 = phVar12->m_head, ((ulong)pCVar1 & 3) == 0) {
        phVar12->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
        local_c0.m_control = (ControlBlock *)&local_d8;
        local_c0.m_queue = phVar12;
        density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
        reentrant_consume_operation::
        element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                  ((reentrant_consume_operation *)&local_c0);
        pMVar4 = density::
                 heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                 reentrant_consume_operation::
                 element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                           ((reentrant_consume_operation *)&local_c0);
        if (pMVar4->m_len != 0) {
          sVar11 = 0;
          do {
            sVar11 = sVar11 + 1;
          } while (pMVar4->m_len != sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Message with checksum ",0x16);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," at ",4);
        density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
        reentrant_consume_operation::
        element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                  ((reentrant_consume_operation *)&local_c0);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        reentrant_consume_operation::commit((reentrant_consume_operation *)&local_c0);
        if (local_c0.m_queue !=
            (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0)
        {
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::cancel_consume_impl
                    ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)local_c0.m_control,(ControlBlock *)local_c0.m_queue);
        }
        phVar12 = local_d8.m_queue;
        phVar10 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_d8.m_put_data.m_control_block;
        if (local_d8.m_queue ==
            (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_d8.m_put_data.m_control_block) goto LAB_00a9a336;
      }
      phVar12 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                ((ulong)pCVar1 & 0xfffffffffffffff8);
    } while (phVar10 !=
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ((ulong)pCVar1 & 0xfffffffffffffff8));
  }
LAB_00a9a336:
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_d8);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c0);
  local_a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_control = (ControlBlock *)0x0;
  local_88.m_head._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_d8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0,(int *)&local_88);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_c0,&local_d8)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
  if (local_c0.m_control == (ControlBlock *)0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3e9,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_c0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0);
  local_a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_control = (ControlBlock *)0x0;
  local_88.m_head._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_d8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0,(int *)&local_88);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_c0,&local_d8)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
  if (local_c0.m_control == (ControlBlock *)0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3f3,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_c0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0);
  local_a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_c0.m_control = (ControlBlock *)0x0;
  local_88.m_head._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_d8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0,(int *)&local_88);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_c0,&local_d8)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
  if ((reentrant_put_transaction<int> *)local_c0.m_control != &local_a0) {
    __assert_fail("transaction.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3fd,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_c0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0);
  local_a0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_88.m_head._0_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            ((reentrant_put_transaction<int> *)&local_c0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_a0,(int *)&local_88);
  local_d8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       local_c0.m_control;
  local_d8.m_put_data.m_control_block = (ControlBlock *)local_c0.m_queue;
  local_d8.m_put_data.m_user_storage = local_c0.m_value.m_pair.m_address;
  local_c0.m_control = (ControlBlock *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&local_c0);
  if ((reentrant_put_transaction<int> *)local_d8.m_queue == (reentrant_put_transaction<int> *)0x0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x409,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::cancel(&local_d8);
  phVar12 = local_a0.m_queue;
  do {
    if (phVar12 ==
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_a0.m_put_data.m_control_block) {
      if ((reentrant_put_transaction<int> *)local_d8.m_queue ==
          (reentrant_put_transaction<int> *)0x0) {
        local_88.m_head = (ControlBlock *)CONCAT44(local_88.m_head._4_4_,0x2a);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        start_reentrant_push<int>
                  ((reentrant_put_transaction<int> *)&local_c0,
                   (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&local_a0,(int *)&local_88);
        density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
        reentrant_put_transaction<int>::operator=
                  ((reentrant_put_transaction<int> *)&local_d8,
                   (reentrant_put_transaction<int> *)&local_c0);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        reentrant_put_transaction<int>::~reentrant_put_transaction
                  ((reentrant_put_transaction<int> *)&local_c0);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        reentrant_put_transaction<int>::commit(&local_d8);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        cbegin(&local_50,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &local_a0);
        local_c0.m_control = local_50.m_control;
        local_c0.m_queue = local_50.m_queue;
        if (local_50.m_control != (ControlBlock *)0x0) {
          lVar14 = 1;
          do {
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            const_iterator::operator++(&local_c0);
            lVar14 = lVar14 + -1;
          } while (local_c0.m_control != (ControlBlock *)0x0);
          if (lVar14 == 0) {
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_a0);
            local_88.m_head = (ControlBlock *)&DAT_0000ffef;
            local_88.m_tail = (ControlBlock *)&DAT_0000ffef;
            local_78._0_4_ = 0x2a;
            local_a0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )density::detail::
                  FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                  ::s_table;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            start_reentrant_dyn_push_copy
                      ((reentrant_put_transaction<void> *)&local_d8,&local_88,
                       (runtime_type<> *)&local_a0,&local_78);
            local_c0.m_control = (ControlBlock *)local_d8.m_queue;
            local_c0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_d8.m_put_data.m_control_block;
            local_c0.m_value.m_pair.m_address = local_d8.m_put_data.m_user_storage;
            local_d8.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_d8);
            piVar3 = (int *)density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::reentrant_put_transaction<void>::element_ptr
                                      ((reentrant_put_transaction<void> *)&local_c0);
            if (*piVar3 != 0x2a) {
              __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x419,
                            "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                           );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Putting an ",0xb);
            prVar6 = density::
                     heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     ::reentrant_put_transaction<void>::complete_type
                               ((reentrant_put_transaction<void> *)&local_c0);
            ptVar7 = density::runtime_type<>::type_info(prVar6);
            pcVar13 = *(char **)(ptVar7 + 8) + (**(char **)(ptVar7 + 8) == '*');
            sVar8 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
            std::ostream::put('H');
            std::ostream::flush();
            local_6c = 1;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            start_reentrant_push<int>(&local_a0,&local_88,&local_6c);
            local_d8.m_queue = local_a0.m_queue;
            local_d8.m_put_data.m_control_block = local_a0.m_put_data.m_control_block;
            local_d8.m_put_data.m_user_storage = local_a0.m_put_data.m_user_storage;
            local_a0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<int>::~reentrant_put_transaction(&local_a0);
            piVar3 = (int *)density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::reentrant_put_transaction<int>::element_ptr(&local_d8);
            if (*piVar3 != 1) {
              __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x421,
                            "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                           );
            }
            piVar3 = (int *)density::
                            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            ::reentrant_put_transaction<int>::element_ptr(&local_d8);
            if (*piVar3 != 1) {
              __assert_fail("put_1.element() == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x422,
                            "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                           );
            }
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d8);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_c0);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy(&local_88);
            local_a0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&DAT_0000ffef;
            local_a0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
            local_78 = (double)CONCAT44(local_78._4_4_,0x2a);
            local_88.m_head =
                 (ControlBlock *)
                 density::detail::
                 FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                 ::s_table;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            start_reentrant_dyn_push_copy
                      ((reentrant_put_transaction<void> *)&local_d8,
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)&local_a0,(runtime_type<> *)&local_88,&local_78);
            local_c0.m_control = (ControlBlock *)local_d8.m_queue;
            local_c0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_d8.m_put_data.m_control_block;
            local_c0.m_value.m_pair.m_address = local_d8.m_put_data.m_user_storage;
            local_d8.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_d8);
            prVar6 = density::
                     heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     ::reentrant_put_transaction<void>::complete_type
                               ((reentrant_put_transaction<void> *)&local_c0);
            if (prVar6->m_feature_table !=
                (tuple_type *)
                density::detail::
                FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                ::s_table) {
              __assert_fail("put.complete_type().is<int>()",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x42b,
                            "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                           );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Putting an ",0xb);
            prVar6 = density::
                     heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     ::reentrant_put_transaction<void>::complete_type
                               ((reentrant_put_transaction<void> *)&local_c0);
            ptVar7 = density::runtime_type<>::type_info(prVar6);
            pcVar13 = *(char **)(ptVar7 + 8) + (**(char **)(ptVar7 + 8) == '*');
            sVar8 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
            std::ostream::put('H');
            std::ostream::flush();
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_c0);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_a0);
            local_c0.m_control = (ControlBlock *)&DAT_0000ffef;
            local_c0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&DAT_0000ffef;
            local_d8.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )CONCAT44(local_d8.m_queue._4_4_,0x2a);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            start_reentrant_push<int>
                      (&local_68,
                       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)&local_c0,(int *)&local_d8);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<int>::~reentrant_put_transaction(&local_68);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_c0);
            local_88.m_head = (ControlBlock *)&DAT_0000ffef;
            local_88.m_tail = (ControlBlock *)&DAT_0000ffef;
            local_6c = 0x2a;
            local_a0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )density::detail::
                  FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
                  ::s_table;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            start_reentrant_dyn_push_copy
                      ((reentrant_put_transaction<void> *)&local_d8,&local_88,
                       (runtime_type<> *)&local_a0,&local_6c);
            local_c0.m_control = (ControlBlock *)local_d8.m_queue;
            local_c0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_d8.m_put_data.m_control_block;
            local_c0.m_value.m_pair.m_address = local_d8.m_put_data.m_user_storage;
            local_d8.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_d8);
            local_78 = 42.0;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            start_reentrant_push<double>
                      ((reentrant_put_transaction<double> *)&local_a0,&local_88,&local_78);
            local_d8.m_queue = local_a0.m_queue;
            local_d8.m_put_data.m_control_block = local_a0.m_put_data.m_control_block;
            local_d8.m_put_data.m_user_storage = local_a0.m_put_data.m_user_storage;
            local_a0.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<double>::~reentrant_put_transaction
                      ((reentrant_put_transaction<double> *)&local_a0);
            pdVar9 = (double *)
                     density::
                     heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     ::reentrant_put_transaction<double>::element_ptr
                               ((reentrant_put_transaction<double> *)&local_d8);
            if ((*pdVar9 == 42.0) && (!NAN(*pdVar9))) {
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_put_transaction<double>::~reentrant_put_transaction
                        ((reentrant_put_transaction<double> *)&local_d8);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_put_transaction<void>::~reentrant_put_transaction
                        ((reentrant_put_transaction<void> *)&local_c0);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              destroy(&local_88);
              return;
            }
            __assert_fail("typed_put.element() == 42.",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x445,
                          "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                         );
          }
        }
        __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x410,
                      "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()")
        ;
      }
      break;
    }
    ppCVar2 = &phVar12->m_head;
    phVar12 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ((ulong)*ppCVar2 & 0xfffffffffffffff8);
  } while (((ulong)*ppCVar2 & 3) != 0);
  __assert_fail("queue.empty() && put.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x40b,"void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
               );
}

Assistant:

void heterogeneous_queue_reentrant_put_transaction_samples()
    {
        using namespace density;
        {
            //! [heter_queue reentrant_put_transaction default_construct example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());
            //! [heter_queue reentrant_put_transaction default_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<heter_queue<int>::reentrant_put_transaction<>>::value,
              "");
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<heter_queue<int>::reentrant_put_transaction<>>::value, "");
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction move_construct example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [heter_queue reentrant_put_transaction move_construct example 1]

            //! [heter_queue reentrant_put_transaction move_construct example 2]
            // reentrant_put_transaction<void> can be move constructed from any reentrant_put_transaction<T>
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move constructed only from reentrant_put_transaction<T>
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_construct example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction move_assign example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            heter_queue<>::reentrant_put_transaction<> transaction2;
            transaction2 = queue.start_reentrant_push(1);
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [heter_queue reentrant_put_transaction move_assign example 1]

            //! [heter_queue reentrant_put_transaction move_assign example 2]
            // reentrant_put_transaction<void> can be move assigned from any reentrant_put_transaction<T>
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move assigned only from reentrant_put_transaction<T>
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_assign example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
            heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_reentrant_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction empty example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_reentrant_push(1);
            assert(!transaction.empty());
            //! [heter_queue reentrant_put_transaction empty example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_reentrant_push(1);
            assert(transaction);
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction queue example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.queue() == nullptr);

            transaction = queue.start_reentrant_push(1);
            assert(transaction.queue() == &queue);
            //! [heter_queue reentrant_put_transaction queue example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction cancel example 1]
            heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_reentrant_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_reentrant_push(42);
            put.commit();
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue reentrant_put_transaction cancel example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction element_ptr example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;

            //! [heter_queue reentrant_put_transaction element_ptr example 1]

            //! [heter_queue reentrant_put_transaction element_ptr example 2]
            auto put_1 = queue.start_reentrant_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            //! [heter_queue reentrant_put_transaction element_ptr example 2]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction destroy example 1]
            queue.start_reentrant_push(
              42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [heter_queue reentrant_put_transaction destroy example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [heter_queue reentrant_typed_put_transaction element example 1]
        }
    }